

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O2

void libdef_push(BuildCtx *ctx,char *p,int arg)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  double dVar7;
  char *ep;
  
  if (ctx->mode != BUILD_libdef) {
    return;
  }
  sVar6 = strlen(p);
  iVar5 = (int)sVar6;
  if (*p == '\"') {
    if ((1 < iVar5) && (p[iVar5 - 1U] == '\"')) {
      p[iVar5 - 1U] = '\0';
      libdef_name(p + 1,0xc0);
      return;
    }
LAB_0010b62a:
    fprintf(_stderr,"Error: bad value for %sPUSH(%s)\n","LJLIB_",p);
  }
  else {
    if ((byte)(*p - 0x30U) < 10) {
      dVar7 = strtod(p,&ep);
      if (*ep != '\0') goto LAB_0010b62a;
      if (optr + 9 < (uint8_t *)((long)&optr + 1U)) {
        *optr = 0xfb;
        *(double *)(optr + 1) = dVar7;
        optr = optr + 9;
        return;
      }
    }
    else {
      iVar4 = strcmp(p,"lastcl");
      if (iVar4 == 0) {
        if (optr + 1 < (uint8_t *)((long)&optr + 1U)) {
          puVar3 = optr + 1;
          *optr = 0xfd;
          optr = puVar3;
          return;
        }
      }
      else {
        if ((iVar5 < 5) || (iVar5 = strncmp(p,"top-",4), puVar3 = optr, iVar5 != 0))
        goto LAB_0010b62a;
        puVar1 = optr + 2;
        if (puVar1 < (uint8_t *)((long)&optr + 1U)) {
          puVar2 = optr + 1;
          *optr = 0xfc;
          optr = puVar2;
          iVar5 = atoi(p + 4);
          optr = puVar1;
          puVar3[1] = (uint8_t)iVar5;
          return;
        }
      }
    }
    fwrite("Error: output buffer overflow\n",0x1e,1,_stderr);
  }
  exit(1);
}

Assistant:

static void libdef_push(BuildCtx *ctx, char *p, int arg)
{
  UNUSED(arg);
  if (ctx->mode == BUILD_libdef) {
    int len = (int)strlen(p);
    if (*p == '"') {
      if (len > 1 && p[len-1] == '"') {
	p[len-1] = '\0';
	libdef_name(p+1, LIBINIT_STRING);
	return;
      }
    } else if (*p >= '0' && *p <= '9') {
      char *ep;
      double d = strtod(p, &ep);
      if (*ep == '\0') {
	if (optr+1+sizeof(double) > obuf+sizeof(obuf)) {
	  fprintf(stderr, "Error: output buffer overflow\n");
	  exit(1);
	}
	*optr++ = LIBINIT_NUMBER;
	memcpy_endian(optr, &d, sizeof(double));
	optr += sizeof(double);
	return;
      }
    } else if (!strcmp(p, "lastcl")) {
      if (optr+1 > obuf+sizeof(obuf)) {
	fprintf(stderr, "Error: output buffer overflow\n");
	exit(1);
      }
      *optr++ = LIBINIT_LASTCL;
      return;
    } else if (len > 4 && !strncmp(p, "top-", 4)) {
      if (optr+2 > obuf+sizeof(obuf)) {
	fprintf(stderr, "Error: output buffer overflow\n");
	exit(1);
      }
      *optr++ = LIBINIT_COPY;
      *optr++ = (uint8_t)atoi(p+4);
      return;
    }
    fprintf(stderr, "Error: bad value for %sPUSH(%s)\n", LIBDEF_PREFIX, p);
    exit(1);
  }
}